

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

DynamicStateInfo *
Fossilize::Hashing::parse_dynamic_state_info
          (DynamicStateInfo *__return_storage_ptr__,VkPipelineDynamicStateCreateInfo *dynamic_info)

{
  uint uVar1;
  VkDynamicState VVar2;
  VkDynamicState *pVVar3;
  ulong uVar4;
  DynamicStateInfo *pDVar5;
  
  __return_storage_ptr__->color_blend_advanced = false;
  __return_storage_ptr__->provoking_vertex_mode = false;
  __return_storage_ptr__->line_rasterization_mode = false;
  __return_storage_ptr__->line_stipple_enable = false;
  __return_storage_ptr__->depth_clip_negative_one_to_one = false;
  __return_storage_ptr__->viewport_w_scaling_enable = false;
  __return_storage_ptr__->viewport_swizzle = false;
  __return_storage_ptr__->coverage_to_color_enable = false;
  __return_storage_ptr__->coverage_to_color_location = false;
  __return_storage_ptr__->coverage_modulation_mode = false;
  __return_storage_ptr__->coverage_modulation_table_enable = false;
  __return_storage_ptr__->coverage_modulation_table = false;
  __return_storage_ptr__->shading_rate_image_enable = false;
  __return_storage_ptr__->representative_fragment_test_enable = false;
  __return_storage_ptr__->coverage_reduction_mode = false;
  __return_storage_ptr__->depth_clamp_range = false;
  __return_storage_ptr__->tessellation_domain_origin = false;
  __return_storage_ptr__->depth_clamp_enable = false;
  __return_storage_ptr__->polygon_mode = false;
  __return_storage_ptr__->rasterization_samples = false;
  __return_storage_ptr__->sample_mask = false;
  __return_storage_ptr__->alpha_to_coverage_enable = false;
  __return_storage_ptr__->alpha_to_one_enable = false;
  __return_storage_ptr__->logic_op_enable = false;
  __return_storage_ptr__->color_blend_enable = false;
  __return_storage_ptr__->color_blend_equation = false;
  __return_storage_ptr__->color_write_mask = false;
  __return_storage_ptr__->rasterization_stream = false;
  __return_storage_ptr__->conservative_rasterization_mode = false;
  __return_storage_ptr__->extra_primitive_overestimation_size = false;
  __return_storage_ptr__->depth_clip_enable = false;
  __return_storage_ptr__->sample_locations_enable = false;
  __return_storage_ptr__->depth_bounds_test_enable = false;
  __return_storage_ptr__->stencil_test_enable = false;
  __return_storage_ptr__->stencil_op = false;
  __return_storage_ptr__->vertex_input = false;
  __return_storage_ptr__->vertex_input_binding_stride = false;
  __return_storage_ptr__->patch_control_points = false;
  __return_storage_ptr__->rasterizer_discard_enable = false;
  __return_storage_ptr__->primitive_restart_enable = false;
  __return_storage_ptr__->logic_op = false;
  __return_storage_ptr__->color_write_enable = false;
  __return_storage_ptr__->depth_bias_enable = false;
  __return_storage_ptr__->discard_rectangle = false;
  __return_storage_ptr__->discard_rectangle_mode = false;
  __return_storage_ptr__->fragment_shading_rate = false;
  __return_storage_ptr__->sample_locations = false;
  __return_storage_ptr__->line_stipple = false;
  __return_storage_ptr__->stencil_compare = false;
  __return_storage_ptr__->stencil_reference = false;
  __return_storage_ptr__->stencil_write_mask = false;
  __return_storage_ptr__->depth_bounds = false;
  __return_storage_ptr__->depth_bias = false;
  __return_storage_ptr__->line_width = false;
  __return_storage_ptr__->blend_constants = false;
  __return_storage_ptr__->scissor = false;
  __return_storage_ptr__->viewport = false;
  __return_storage_ptr__->scissor_count = false;
  __return_storage_ptr__->viewport_count = false;
  __return_storage_ptr__->cull_mode = false;
  __return_storage_ptr__->front_face = false;
  __return_storage_ptr__->depth_test_enable = false;
  __return_storage_ptr__->depth_write_enable = false;
  __return_storage_ptr__->depth_compare_op = false;
  uVar1 = dynamic_info->dynamicStateCount;
  if ((ulong)uVar1 != 0) {
    pVVar3 = dynamic_info->pDynamicStates;
    uVar4 = 0;
    do {
      VVar2 = pVVar3[uVar4];
      if (0x3ba09a47 < (int)VVar2) {
        switch(VVar2) {
        case VK_DYNAMIC_STATE_TESSELLATION_DOMAIN_ORIGIN_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->tessellation_domain_origin;
          break;
        case VK_DYNAMIC_STATE_DEPTH_CLAMP_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_clamp_enable;
          break;
        case VK_DYNAMIC_STATE_POLYGON_MODE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->polygon_mode;
          break;
        case VK_DYNAMIC_STATE_RASTERIZATION_SAMPLES_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->rasterization_samples;
          break;
        case VK_DYNAMIC_STATE_SAMPLE_MASK_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->sample_mask;
          break;
        case VK_DYNAMIC_STATE_ALPHA_TO_COVERAGE_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->alpha_to_coverage_enable;
          break;
        case VK_DYNAMIC_STATE_ALPHA_TO_ONE_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->alpha_to_one_enable;
          break;
        case VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->logic_op_enable;
          break;
        case VK_DYNAMIC_STATE_COLOR_BLEND_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->color_blend_enable;
          break;
        case VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->color_blend_equation;
          break;
        case VK_DYNAMIC_STATE_COLOR_WRITE_MASK_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->color_write_mask;
          break;
        case VK_DYNAMIC_STATE_RASTERIZATION_STREAM_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->rasterization_stream;
          break;
        case VK_DYNAMIC_STATE_CONSERVATIVE_RASTERIZATION_MODE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->conservative_rasterization_mode;
          break;
        case VK_DYNAMIC_STATE_EXTRA_PRIMITIVE_OVERESTIMATION_SIZE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->extra_primitive_overestimation_size;
          break;
        case VK_DYNAMIC_STATE_DEPTH_CLIP_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_clip_enable;
          break;
        case VK_DYNAMIC_STATE_SAMPLE_LOCATIONS_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->sample_locations_enable;
          break;
        case VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->color_blend_advanced;
          break;
        case VK_DYNAMIC_STATE_PROVOKING_VERTEX_MODE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->provoking_vertex_mode;
          break;
        case VK_DYNAMIC_STATE_LINE_RASTERIZATION_MODE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->line_rasterization_mode;
          break;
        case VK_DYNAMIC_STATE_LINE_STIPPLE_ENABLE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->line_stipple_enable;
          break;
        case VK_DYNAMIC_STATE_DEPTH_CLIP_NEGATIVE_ONE_TO_ONE_EXT:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_clip_negative_one_to_one;
          break;
        case VK_DYNAMIC_STATE_VIEWPORT_W_SCALING_ENABLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->viewport_w_scaling_enable;
          break;
        case VK_DYNAMIC_STATE_VIEWPORT_SWIZZLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->viewport_swizzle;
          break;
        case VK_DYNAMIC_STATE_COVERAGE_TO_COLOR_ENABLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->coverage_to_color_enable;
          break;
        case VK_DYNAMIC_STATE_COVERAGE_TO_COLOR_LOCATION_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->coverage_to_color_location;
          break;
        case VK_DYNAMIC_STATE_COVERAGE_MODULATION_MODE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->coverage_modulation_mode;
          break;
        case VK_DYNAMIC_STATE_COVERAGE_MODULATION_TABLE_ENABLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->coverage_modulation_table_enable;
          break;
        case VK_DYNAMIC_STATE_COVERAGE_MODULATION_TABLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->coverage_modulation_table;
          break;
        case VK_DYNAMIC_STATE_SHADING_RATE_IMAGE_ENABLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->shading_rate_image_enable;
          break;
        case VK_DYNAMIC_STATE_REPRESENTATIVE_FRAGMENT_TEST_ENABLE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->representative_fragment_test_enable;
          break;
        case VK_DYNAMIC_STATE_COVERAGE_REDUCTION_MODE_NV:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->coverage_reduction_mode;
          break;
        default:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->color_write_enable;
          if ((VVar2 != VK_DYNAMIC_STATE_COLOR_WRITE_ENABLE_EXT) &&
             (pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_clamp_range,
             VVar2 != VK_DYNAMIC_STATE_DEPTH_CLAMP_RANGE_EXT)) goto switchD_001127f1_caseD_3b9edcfa;
        }
        goto switchD_00112846_caseD_3;
      }
      if ((int)VVar2 < 0x3b9edcf8) {
        if ((int)VVar2 < 0x3b9c4cb8) {
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_bias;
          switch(VVar2) {
          case VK_DYNAMIC_STATE_VIEWPORT:
            goto switchD_00112846_caseD_0;
          case VK_DYNAMIC_STATE_SCISSOR:
            goto switchD_00112846_caseD_1;
          case VK_DYNAMIC_STATE_LINE_WIDTH:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->line_width;
            break;
          case VK_DYNAMIC_STATE_DEPTH_BIAS:
            break;
          case VK_DYNAMIC_STATE_BLEND_CONSTANTS:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->blend_constants;
            break;
          case VK_DYNAMIC_STATE_DEPTH_BOUNDS:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_bounds;
            break;
          case VK_DYNAMIC_STATE_STENCIL_COMPARE_MASK:
            pDVar5 = __return_storage_ptr__;
            break;
          case VK_DYNAMIC_STATE_STENCIL_WRITE_MASK:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->stencil_write_mask;
            break;
          case VK_DYNAMIC_STATE_STENCIL_REFERENCE:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->stencil_reference;
            break;
          default:
            goto switchD_001127f1_caseD_3b9edcfa;
          }
          goto switchD_00112846_caseD_3;
        }
        if ((int)VVar2 < 0x3b9cf898) {
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->discard_rectangle;
          if ((VVar2 == VK_DYNAMIC_STATE_DISCARD_RECTANGLE_EXT) ||
             (pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->discard_rectangle_mode,
             VVar2 == VK_DYNAMIC_STATE_DISCARD_RECTANGLE_MODE_EXT)) goto switchD_00112846_caseD_3;
        }
        else {
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->sample_locations;
          if ((VVar2 == VK_DYNAMIC_STATE_SAMPLE_LOCATIONS_EXT) ||
             ((pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->fragment_shading_rate,
              VVar2 == VK_DYNAMIC_STATE_FRAGMENT_SHADING_RATE_KHR ||
              (pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->line_stipple,
              VVar2 == VK_DYNAMIC_STATE_LINE_STIPPLE)))) goto switchD_00112846_caseD_3;
        }
      }
      else {
        switch(VVar2) {
        case VK_DYNAMIC_STATE_CULL_MODE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->cull_mode;
          break;
        case VK_DYNAMIC_STATE_FRONT_FACE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->front_face;
          break;
        case VK_DYNAMIC_STATE_PRIMITIVE_TOPOLOGY:
          goto switchD_001127f1_caseD_3b9edcfa;
        case VK_DYNAMIC_STATE_VIEWPORT_WITH_COUNT:
          __return_storage_ptr__->viewport_count = true;
switchD_00112846_caseD_0:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->viewport;
          break;
        case VK_DYNAMIC_STATE_SCISSOR_WITH_COUNT:
          __return_storage_ptr__->scissor_count = true;
switchD_00112846_caseD_1:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->scissor;
          break;
        case VK_DYNAMIC_STATE_VERTEX_INPUT_BINDING_STRIDE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->vertex_input_binding_stride;
          break;
        case VK_DYNAMIC_STATE_DEPTH_TEST_ENABLE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_test_enable;
          break;
        case VK_DYNAMIC_STATE_DEPTH_WRITE_ENABLE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_write_enable;
          break;
        case VK_DYNAMIC_STATE_DEPTH_COMPARE_OP:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_compare_op;
          break;
        case VK_DYNAMIC_STATE_DEPTH_BOUNDS_TEST_ENABLE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_bounds_test_enable;
          break;
        case VK_DYNAMIC_STATE_STENCIL_TEST_ENABLE:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->stencil_test_enable;
          break;
        case VK_DYNAMIC_STATE_STENCIL_OP:
          pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->stencil_op;
          break;
        default:
          switch(VVar2) {
          case VK_DYNAMIC_STATE_PATCH_CONTROL_POINTS_EXT:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->patch_control_points;
            break;
          case VK_DYNAMIC_STATE_RASTERIZER_DISCARD_ENABLE:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->rasterizer_discard_enable;
            break;
          case VK_DYNAMIC_STATE_DEPTH_BIAS_ENABLE:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->depth_bias_enable;
            break;
          case VK_DYNAMIC_STATE_LOGIC_OP_EXT:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->logic_op;
            break;
          case VK_DYNAMIC_STATE_PRIMITIVE_RESTART_ENABLE:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->primitive_restart_enable;
            break;
          default:
            pDVar5 = (DynamicStateInfo *)&__return_storage_ptr__->vertex_input;
            if (VVar2 != VK_DYNAMIC_STATE_VERTEX_INPUT_EXT) goto switchD_001127f1_caseD_3b9edcfa;
          }
        }
switchD_00112846_caseD_3:
        pDVar5->stencil_compare = true;
      }
switchD_001127f1_caseD_3b9edcfa:
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

static DynamicStateInfo parse_dynamic_state_info(const VkPipelineDynamicStateCreateInfo &dynamic_info)
{
	DynamicStateInfo info = {};
#define DYN_STATE(state, member) case VK_DYNAMIC_STATE_##state: info.member = true; break
	for (uint32_t i = 0; i < dynamic_info.dynamicStateCount; i++)
	{
		switch (dynamic_info.pDynamicStates[i])
		{
		DYN_STATE(DEPTH_BIAS, depth_bias);
		DYN_STATE(DEPTH_BOUNDS, depth_bounds);
		DYN_STATE(STENCIL_WRITE_MASK, stencil_write_mask);
		DYN_STATE(STENCIL_REFERENCE, stencil_reference);
		DYN_STATE(STENCIL_COMPARE_MASK, stencil_compare);
		DYN_STATE(BLEND_CONSTANTS, blend_constants);
		DYN_STATE(SCISSOR, scissor);
		DYN_STATE(VIEWPORT, viewport);
		DYN_STATE(LINE_WIDTH, line_width);
		DYN_STATE(CULL_MODE, cull_mode);
		DYN_STATE(FRONT_FACE, front_face);
		DYN_STATE(DEPTH_TEST_ENABLE_EXT, depth_test_enable);
		DYN_STATE(DEPTH_WRITE_ENABLE_EXT, depth_write_enable);
		DYN_STATE(DEPTH_COMPARE_OP_EXT, depth_compare_op);
		DYN_STATE(DEPTH_BOUNDS_TEST_ENABLE_EXT, depth_bounds_test_enable);
		DYN_STATE(STENCIL_TEST_ENABLE_EXT, stencil_test_enable);
		DYN_STATE(STENCIL_OP_EXT, stencil_op);
		DYN_STATE(VERTEX_INPUT_EXT, vertex_input);
		DYN_STATE(VERTEX_INPUT_BINDING_STRIDE_EXT, vertex_input_binding_stride);
		DYN_STATE(PATCH_CONTROL_POINTS_EXT, patch_control_points);
		DYN_STATE(RASTERIZER_DISCARD_ENABLE_EXT, rasterizer_discard_enable);
		DYN_STATE(DEPTH_BIAS_ENABLE_EXT, depth_bias_enable);
		DYN_STATE(LOGIC_OP_EXT, logic_op);
		DYN_STATE(COLOR_WRITE_ENABLE_EXT, color_write_enable);
		DYN_STATE(PRIMITIVE_RESTART_ENABLE_EXT, primitive_restart_enable);
		DYN_STATE(DISCARD_RECTANGLE_EXT, discard_rectangle);
		DYN_STATE(DISCARD_RECTANGLE_MODE_EXT, discard_rectangle_mode);
		DYN_STATE(FRAGMENT_SHADING_RATE_KHR, fragment_shading_rate);
		DYN_STATE(SAMPLE_LOCATIONS_EXT, sample_locations);
		DYN_STATE(LINE_STIPPLE_EXT, line_stipple);

		// Dynamic state 3
		DYN_STATE(TESSELLATION_DOMAIN_ORIGIN_EXT, tessellation_domain_origin);
		DYN_STATE(DEPTH_CLAMP_ENABLE_EXT, depth_clamp_enable);
		DYN_STATE(POLYGON_MODE_EXT, polygon_mode);
		DYN_STATE(RASTERIZATION_SAMPLES_EXT, rasterization_samples);
		DYN_STATE(SAMPLE_MASK_EXT, sample_mask);
		DYN_STATE(ALPHA_TO_COVERAGE_ENABLE_EXT, alpha_to_coverage_enable);
		DYN_STATE(ALPHA_TO_ONE_ENABLE_EXT, alpha_to_one_enable);
		DYN_STATE(LOGIC_OP_ENABLE_EXT, logic_op_enable);
		DYN_STATE(COLOR_BLEND_ENABLE_EXT, color_blend_enable);
		DYN_STATE(COLOR_BLEND_EQUATION_EXT, color_blend_equation);
		DYN_STATE(COLOR_WRITE_MASK_EXT, color_write_mask);
		DYN_STATE(RASTERIZATION_STREAM_EXT, rasterization_stream);
		DYN_STATE(CONSERVATIVE_RASTERIZATION_MODE_EXT, conservative_rasterization_mode);
		DYN_STATE(EXTRA_PRIMITIVE_OVERESTIMATION_SIZE_EXT, extra_primitive_overestimation_size);
		DYN_STATE(DEPTH_CLIP_ENABLE_EXT, depth_clip_enable);
		DYN_STATE(SAMPLE_LOCATIONS_ENABLE_EXT, sample_locations_enable);
		DYN_STATE(COLOR_BLEND_ADVANCED_EXT, color_blend_advanced);
		DYN_STATE(PROVOKING_VERTEX_MODE_EXT, provoking_vertex_mode);
		DYN_STATE(LINE_RASTERIZATION_MODE_EXT, line_rasterization_mode);
		DYN_STATE(LINE_STIPPLE_ENABLE_EXT, line_stipple_enable);
		DYN_STATE(DEPTH_CLIP_NEGATIVE_ONE_TO_ONE_EXT, depth_clip_negative_one_to_one);
		DYN_STATE(VIEWPORT_W_SCALING_ENABLE_NV, viewport_w_scaling_enable);
		DYN_STATE(VIEWPORT_SWIZZLE_NV, viewport_swizzle);
		DYN_STATE(COVERAGE_TO_COLOR_ENABLE_NV, coverage_to_color_enable);
		DYN_STATE(COVERAGE_TO_COLOR_LOCATION_NV, coverage_to_color_location);
		DYN_STATE(COVERAGE_MODULATION_MODE_NV, coverage_modulation_mode);
		DYN_STATE(COVERAGE_MODULATION_TABLE_ENABLE_NV, coverage_modulation_table_enable);
		DYN_STATE(COVERAGE_MODULATION_TABLE_NV, coverage_modulation_table);
		DYN_STATE(SHADING_RATE_IMAGE_ENABLE_NV, shading_rate_image_enable);
		DYN_STATE(REPRESENTATIVE_FRAGMENT_TEST_ENABLE_NV, representative_fragment_test_enable);
		DYN_STATE(COVERAGE_REDUCTION_MODE_NV, coverage_reduction_mode);

		case VK_DYNAMIC_STATE_SCISSOR_WITH_COUNT_EXT:
			info.scissor_count = true;
			info.scissor = true;
			break;

		case VK_DYNAMIC_STATE_VIEWPORT_WITH_COUNT_EXT:
			info.viewport_count = true;
			info.viewport = true;
			break;

		DYN_STATE(DEPTH_CLAMP_RANGE_EXT, depth_clamp_range);

		default:
			break;
		}
	}
#undef DYN_STATE

	return info;
}